

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_tempo.c
# Opt level: O2

void remove_last_tempo_with_pulses(smf_t *smf,int pulses)

{
  smf_tempo_t *__ptr;
  
  if (smf->tempo_array->len != 0) {
    __ptr = smf_get_last_tempo(smf);
    if (__ptr->time_pulses == pulses) {
      free(__ptr);
      g_ptr_array_remove_index(smf->tempo_array,smf->tempo_array->len - 1);
      return;
    }
  }
  return;
}

Assistant:

void
remove_last_tempo_with_pulses(smf_t *smf, int pulses)
{
	smf_tempo_t *tempo;

	/* XXX: This is a partial workaround for the following problem: we have two tempo-related
	   events, A and B, that occur at the same time.  We remove B, then try to remove
	   A.  However, both tempo changes got coalesced in new_tempo(), so it is impossible
	   to remove B. */
	if (smf->tempo_array->len == 0)
		return;

	tempo = smf_get_last_tempo(smf);

	/* Workaround part two. */
	if (tempo->time_pulses != pulses)
		return;

	memset(tempo, 0, sizeof(smf_tempo_t));
	free(tempo);

	g_ptr_array_remove_index(smf->tempo_array, smf->tempo_array->len - 1);
}